

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  HttpCallback local_8470;
  allocator<char> local_8449;
  string local_8448;
  undefined1 local_8428 [8];
  HttpServer server;
  InetAddress address;
  ElectricityBill bill;
  EventLoop loop;
  string local_78;
  int local_44;
  undefined1 local_40 [4];
  int opt;
  string log_path;
  bool log_to_file;
  bool daemon;
  char **argv_local;
  int argc_local;
  
  log_path.field_2._M_local_buf[0xf] = '\0';
  log_path.field_2._M_local_buf[0xe] = '\0';
  std::__cxx11::string::string((string *)local_40);
  local_44 = -1;
  while (local_44 = getopt(argc,argv,"w:l:d"), local_44 != -1) {
    if (local_44 == 100) {
      log_path.field_2._M_local_buf[0xf] = '\x01';
    }
    else if (local_44 == 0x6c) {
      log_path.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::operator=((string *)local_40,_optarg);
    }
    else if (local_44 == 0x77) {
      std::__cxx11::string::operator=((string *)&web_root_abi_cxx11_,_optarg);
    }
  }
  if ((log_path.field_2._M_local_buf[0xf] & 1U) != 0) {
    printf("daemon run");
    higan::System::DaemonRun();
  }
  if ((log_path.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"df",
               (allocator<char> *)((long)&loop.timer_manager_.min_expire_time.microsecond_time_ + 7)
              );
    higan::Logger::SetLogToFile((string *)local_40,&local_78,false);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&loop.timer_manager_.min_expire_time.microsecond_time_ + 7)
              );
  }
  signal(0xd,(__sighandler_t)0x1);
  higan::EventLoop::EventLoop
            ((EventLoop *)
             &bill.room_informations_.super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ElectricityBill::ElectricityBill
            ((ElectricityBill *)&address.port_,
             (EventLoop *)
             &bill.room_informations_.super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&web_root_abi_cxx11_);
  g_bill = (ElectricityBill *)&address.port_;
  higan::InetAddress::InetAddress((InetAddress *)&server.on_http_request_._M_invoker,4000);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8448,"ElectricityBill",&local_8449);
  higan::HttpServer::HttpServer
            ((HttpServer *)local_8428,
             (EventLoop *)
             &bill.room_informations_.super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (InetAddress *)&server.on_http_request_._M_invoker,&local_8448);
  std::__cxx11::string::~string((string *)&local_8448);
  std::allocator<char>::~allocator(&local_8449);
  std::
  function<void(std::shared_ptr<higan::TcpConnection>const&,higan::HttpRequest_const&,higan::HttpResponse&)>
  ::
  function<void(&)(std::shared_ptr<higan::TcpConnection>const&,higan::HttpRequest_const&,higan::HttpResponse&),void>
            ((function<void(std::shared_ptr<higan::TcpConnection>const&,higan::HttpRequest_const&,higan::HttpResponse&)>
              *)&local_8470,OnHttpRequest);
  higan::HttpServer::SetHttpRequestCallback((HttpServer *)local_8428,&local_8470);
  std::
  function<void_(const_std::shared_ptr<higan::TcpConnection>_&,_const_higan::HttpRequest_&,_higan::HttpResponse_&)>
  ::~function(&local_8470);
  higan::HttpServer::Start((HttpServer *)local_8428);
  higan::EventLoop::Loop
            ((EventLoop *)
             &bill.room_informations_.super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  higan::HttpServer::~HttpServer((HttpServer *)local_8428);
  higan::InetAddress::~InetAddress((InetAddress *)&server.on_http_request_._M_invoker);
  ElectricityBill::~ElectricityBill((ElectricityBill *)&address.port_);
  higan::EventLoop::~EventLoop
            ((EventLoop *)
             &bill.room_informations_.super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_40);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	bool daemon = false;
	bool log_to_file = false;
	std::string log_path;

	int opt = -1;
	while ((opt = getopt(argc, argv, "w:l:d")) != -1)
	{
		switch (opt)
		{
			case 'w':
			{
				web_root = optarg;
				break;
			}
			case 'l':
			{
				log_to_file = true;
				log_path = optarg;
				break;
			}
			case 'd':
			{
				daemon = true;
				break;
			}
			default:
				break;
		}
	}

	if (daemon)
	{
		printf("daemon run");
		higan::System::DaemonRun();
	}
	if (log_to_file)
	{
		higan::Logger::SetLogToFile(log_path, "df", false);
	}

	signal(SIGPIPE, SIG_IGN);

	higan::EventLoop loop;

	ElectricityBill bill(&loop, web_root);
	g_bill = &bill;

	higan::InetAddress address{4000};

	higan::HttpServer server{&loop, address, "ElectricityBill"};
	server.SetHttpRequestCallback(OnHttpRequest);

	server.Start();
	loop.Loop();

	return 0;
}